

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Gia_Man_t * Lf_ManDeriveMapping(Lf_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  Lf_Cut_t *pLVar4;
  int local_28;
  int local_24;
  int k;
  int i;
  Lf_Cut_t *pCut;
  Vec_Int_t *vMapping;
  Lf_Man_t *p_local;
  
  if ((p->pPars->fCutMin != 0) || (p->pGia->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                  ,0x6b2,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
  }
  iVar1 = Gia_ManObjNum(p->pGia);
  p_00 = Vec_IntAlloc(iVar1 + (int)p->pPars->Edge + (int)p->pPars->Area * 2);
  iVar1 = Gia_ManObjNum(p->pGia);
  Vec_IntFill(p_00,iVar1,0);
  local_24 = 0;
  do {
    if (p->pGia->nObjs <= local_24) {
      iVar1 = Vec_IntCap(p_00);
      if (iVar1 != 0x10) {
        iVar1 = Vec_IntSize(p_00);
        iVar2 = Vec_IntCap(p_00);
        if (iVar1 != iVar2) {
          __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                        ,0x6c2,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
        }
      }
      p->pGia->vMapping = p_00;
      return p->pGia;
    }
    pGVar3 = Gia_ManObj(p->pGia,local_24);
    iVar1 = Gia_ObjIsAnd(pGVar3);
    if ((iVar1 != 0) && (iVar1 = Lf_ObjMapRefNum(p,local_24), iVar1 != 0)) {
      pGVar3 = Gia_ManObj(p->pGia,local_24);
      iVar1 = Gia_ObjIsBuf(pGVar3);
      if (iVar1 != 0) {
        __assert_fail("!Gia_ObjIsBuf(Gia_ManObj(p->pGia,i))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                      ,0x6b9,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
      }
      pLVar4 = Lf_ObjCutBest(p,local_24);
      if ((*(uint *)&pLVar4->field_0x14 >> 0x17 & 1) != 0) {
        __assert_fail("!pCut->fMux7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaLf.c"
                      ,0x6bb,"Gia_Man_t *Lf_ManDeriveMapping(Lf_Man_t *)");
      }
      iVar1 = Vec_IntSize(p_00);
      Vec_IntWriteEntry(p_00,local_24,iVar1);
      Vec_IntPush(p_00,*(uint *)&pLVar4->field_0x14 >> 0x18);
      for (local_28 = 0; local_28 < (int)(*(uint *)&pLVar4->field_0x14 >> 0x18);
          local_28 = local_28 + 1) {
        Vec_IntPush(p_00,*(int *)((long)&pLVar4[1].Sign + (long)local_28 * 4));
      }
      Vec_IntPush(p_00,local_24);
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Lf_ManDeriveMapping( Lf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Lf_Cut_t * pCut;
    int i, k;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        assert( !Gia_ObjIsBuf(Gia_ManObj(p->pGia,i)) );
        pCut = Lf_ObjCutBest( p, i );
        assert( !pCut->fMux7 );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, pCut->nLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_IntPush( vMapping, pCut->pLeaves[k] );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    return p->pGia;
}